

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O1

int csp_kiss_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  uint8_t uVar1;
  undefined8 *puVar2;
  void *driver_data;
  uint8_t *puVar3;
  undefined8 in_RAX;
  undefined8 uVar4;
  uint8_t *puVar5;
  long lVar6;
  uchar esc_esc [2];
  uchar esc_end [2];
  uchar stop [1];
  uchar start [2];
  undefined8 local_38;
  
  puVar2 = (undefined8 *)iface->interface_data;
  driver_data = iface->driver_data;
  local_38 = in_RAX;
  csp_usart_lock(driver_data);
  csp_crc32_append(packet);
  csp_id_prepend(packet);
  local_38 = CONCAT26(0xc0,(undefined6)local_38);
  local_38 = CONCAT44(local_38._4_4_,0xdcdb0000);
  local_38 = CONCAT62(local_38._2_6_,0xdddb);
  puVar3 = (packet->field_0).field_1.frame_begin;
  (*(code *)*puVar2)(driver_data,(long)&local_38 + 6,2);
  if ((packet->field_0).field_1.frame_length != 0) {
    lVar6 = 0;
    do {
      uVar1 = puVar3[lVar6];
      if (uVar1 == 0xdb) {
        uVar4 = 2;
        puVar5 = (uint8_t *)&local_38;
      }
      else if (uVar1 == 0xc0) {
        uVar4 = 2;
        puVar5 = (uint8_t *)((long)&local_38 + 2);
      }
      else {
        uVar4 = 1;
        puVar5 = puVar3 + lVar6;
      }
      (*(code *)*puVar2)(driver_data,puVar5,uVar4);
      lVar6 = lVar6 + 1;
    } while ((uint)lVar6 < (uint)(packet->field_0).field_1.frame_length);
  }
  local_38._0_6_ = CONCAT15(0xc0,(undefined5)local_38);
  (*(code *)*puVar2)(driver_data,(long)&local_38 + 5,1);
  csp_usart_unlock(driver_data);
  csp_buffer_free(packet);
  return 0;
}

Assistant:

int csp_kiss_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_kiss_interface_data_t * ifdata = iface->interface_data;
	void * driver = iface->driver_data;

	/* Lock (before modifying packet) */
	csp_usart_lock(driver);

	/* Add CRC32 checksum */
	csp_crc32_append(packet);

	/* Save the outgoing id in the buffer */
	csp_id_prepend(packet);

	/* Transmit data */
	const unsigned char start[] = {FEND, TNC_DATA};
	const unsigned char esc_end[] = {FESC, TFEND};
	const unsigned char esc_esc[] = {FESC, TFESC};
	const unsigned char * data = packet->frame_begin;

	ifdata->tx_func(driver, start, sizeof(start));

	for (unsigned int i = 0; i < packet->frame_length; i++, ++data) {
		if (*data == FEND) {
			ifdata->tx_func(driver, esc_end, sizeof(esc_end));
			continue;
		}
		if (*data == FESC) {
			ifdata->tx_func(driver, esc_esc, sizeof(esc_esc));
			continue;
		}
		ifdata->tx_func(driver, data, 1);
	}
	const unsigned char stop[] = {FEND};
	ifdata->tx_func(driver, stop, sizeof(stop));

	/* Unlock */
	csp_usart_unlock(driver);

	/* Free data */
	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}